

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Tile * createTile(Image *image,int x,int y,int w,int h,
                 vector<Tile_*,_std::allocator<Tile_*>_> *tiles,bool mirrored)

{
  uint uVar1;
  pointer ppTVar2;
  bool bVar3;
  Tile *this;
  Tile **ppTVar4;
  Tile *pTVar5;
  pointer ppTVar6;
  uchar *__dest;
  Tile *pTVar7;
  pointer __src;
  vector<Tile_*,_std::allocator<Tile_*>_> *__range1;
  
  this = (Tile *)operator_new(0x50);
  Tile::Tile(this,0,false,false,false,(Tile *)0x0);
  if (0 < h) {
    uVar1 = image->width;
    __dest = this->data;
    __src = (image->pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start + (long)x + (ulong)(y * uVar1);
    do {
      memcpy(__dest,__src,(long)w);
      __dest = __dest + w;
      __src = __src + uVar1;
      h = h + -1;
    } while (h != 0);
  }
  ppTVar2 = (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar6 = (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppTVar6 != ppTVar2; ppTVar6 = ppTVar6 + 1) {
    pTVar5 = *ppTVar6;
    bVar3 = Tile::isDataEqual(this,pTVar5);
    if (bVar3) {
      this->original_tile = pTVar5;
      if (pTVar5 != (Tile *)0x0) {
        this->is_duplicate = true;
      }
      goto LAB_00115f41;
    }
  }
  this->original_tile = (Tile *)0x0;
LAB_00115f41:
  ppTVar4 = &this->original_tile;
  if ((mirrored) && (this->is_duplicate == false)) {
    pTVar5 = Tile::flipX(this);
    ppTVar2 = (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppTVar6 = (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
                   super__Vector_impl_data._M_start; ppTVar6 != ppTVar2; ppTVar6 = ppTVar6 + 1) {
      pTVar7 = *ppTVar6;
      bVar3 = Tile::isDataEqual(pTVar5,pTVar7);
      if (bVar3) goto LAB_00115f8e;
    }
    pTVar7 = (Tile *)0x0;
LAB_00115f8e:
    *ppTVar4 = pTVar7;
    operator_delete(pTVar5);
    if (*ppTVar4 == (Tile *)0x0) {
      pTVar5 = Tile::flipY(this);
      ppTVar2 = (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppTVar6 = (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
                     super__Vector_impl_data._M_start; ppTVar6 != ppTVar2; ppTVar6 = ppTVar6 + 1) {
        pTVar7 = *ppTVar6;
        bVar3 = Tile::isDataEqual(pTVar5,pTVar7);
        if (bVar3) goto LAB_00115fe1;
      }
      pTVar7 = (Tile *)0x0;
LAB_00115fe1:
      *ppTVar4 = pTVar7;
      operator_delete(pTVar5);
      if (*ppTVar4 == (Tile *)0x0) {
        pTVar5 = Tile::flipXY(this);
        ppTVar2 = (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppTVar6 = (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
                       super__Vector_impl_data._M_start; ppTVar6 != ppTVar2; ppTVar6 = ppTVar6 + 1)
        {
          pTVar7 = *ppTVar6;
          bVar3 = Tile::isDataEqual(pTVar5,pTVar7);
          if (bVar3) goto LAB_00116031;
        }
        pTVar7 = (Tile *)0x0;
LAB_00116031:
        *ppTVar4 = pTVar7;
        operator_delete(pTVar5);
        if (*ppTVar4 == (Tile *)0x0) {
          return this;
        }
        this->flipped_x = true;
        this->flipped_y = true;
      }
      else {
        this->flipped_y = true;
      }
    }
    else {
      this->flipped_x = true;
    }
    this->is_duplicate = true;
  }
  return this;
}

Assistant:

Tile *createTile(Image *image, int x, int y, int w, int h, std::vector<Tile *> *tiles, bool mirrored) {
    Tile *tile = new Tile(0, false, false, false, nullptr);

    unsigned char *ptr = &image->pixels[0] + y * image->width + x;
    unsigned char *tile_ptr = tile->data;
    for (int i = 0; i < h; i++) {
        memcpy(tile_ptr, ptr, w);
        tile_ptr += w;
        ptr += image->width;
    }

    tile->original_tile = find_duplicate(tile, tiles);
    if (tile->original_tile) {
        tile->is_duplicate = true;
    }

    if (mirrored && !tile->is_duplicate) {
        Tile *flipped = tile->flipX();
        tile->original_tile = find_duplicate(flipped, tiles);
        delete flipped;
        if (tile->original_tile) {
            tile->flipped_x = true;
            tile->is_duplicate = true;
        } else {
            flipped = tile->flipY();
            tile->original_tile = find_duplicate(flipped, tiles);
            delete flipped;
            if (tile->original_tile) {
                tile->flipped_y = true;
                tile->is_duplicate = true;
            } else {
                flipped = tile->flipXY();
                tile->original_tile = find_duplicate(flipped, tiles);
                delete flipped;
                if (tile->original_tile) {
                    tile->flipped_x = true;
                    tile->flipped_y = true;
                    tile->is_duplicate = true;
                }
            }
        }
    }

    return tile;
}